

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O2

int LogLuvVSetField(TIFF *tif,uint32_t tag,__va_list_tag *ap)

{
  uint uVar1;
  undefined4 uVar2;
  uint8_t *puVar3;
  int iVar4;
  tmsize_t tVar5;
  undefined4 *puVar6;
  uint *puVar7;
  char *fmt;
  char *module;
  undefined8 uVar8;
  undefined8 uStack_20;
  
  puVar3 = tif->tif_data;
  if (tag == 0x10019) {
    uVar1 = ap->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar7 = (uint *)((ulong)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      puVar7 = (uint *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar7 + 2;
    }
    uVar1 = *puVar7;
    *(uint *)(puVar3 + 8) = uVar1;
    if (1 < uVar1) {
      module = "LogLuvVSetField";
      fmt = "Unknown encoding %d for LogLuv compression";
      goto LAB_00262eae;
    }
  }
  else {
    if (tag != 0x10018) {
      iVar4 = (**(code **)(puVar3 + 0x30))(tif);
      return iVar4;
    }
    uVar1 = ap->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar6 = (undefined4 *)((ulong)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      puVar6 = (undefined4 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar6 + 2;
    }
    uVar2 = *puVar6;
    *(undefined4 *)(puVar3 + 4) = uVar2;
    uStack_20 = 0x20;
    switch(uVar2) {
    case 0:
      uVar8 = 3;
      break;
    case 1:
      uVar8 = 2;
      uStack_20 = 0x10;
      break;
    case 2:
      uVar8 = 1;
      TIFFSetField(tif,0x115,1);
      break;
    case 3:
      uVar8 = 1;
      uStack_20 = 8;
      break;
    default:
      module = tif->tif_name;
      fmt = "Unknown data format %d for LogLuv compression";
LAB_00262eae:
      TIFFErrorExtR(tif,module,fmt);
      return 0;
    }
    TIFFSetField(tif,0x102,uStack_20);
    TIFFSetField(tif,0x153,uVar8);
    if ((tif->tif_flags & 0x400) == 0) {
      tVar5 = -1;
    }
    else {
      tVar5 = TIFFTileSize(tif);
    }
    tif->tif_tilesize = tVar5;
    tVar5 = TIFFScanlineSize(tif);
    tif->tif_scanlinesize = tVar5;
  }
  return 1;
}

Assistant:

static int LogLuvVSetField(TIFF *tif, uint32_t tag, va_list ap)
{
    static const char module[] = "LogLuvVSetField";
    LogLuvState *sp = DecoderState(tif);
    int bps, fmt;

    switch (tag)
    {
        case TIFFTAG_SGILOGDATAFMT:
            sp->user_datafmt = (int)va_arg(ap, int);
            /*
             * Tweak the TIFF header so that the rest of libtiff knows what
             * size of data will be passed between app and library, and
             * assume that the app knows what it is doing and is not
             * confused by these header manipulations...
             */
            switch (sp->user_datafmt)
            {
                case SGILOGDATAFMT_FLOAT:
                    bps = 32;
                    fmt = SAMPLEFORMAT_IEEEFP;
                    break;
                case SGILOGDATAFMT_16BIT:
                    bps = 16;
                    fmt = SAMPLEFORMAT_INT;
                    break;
                case SGILOGDATAFMT_RAW:
                    bps = 32;
                    fmt = SAMPLEFORMAT_UINT;
                    TIFFSetField(tif, TIFFTAG_SAMPLESPERPIXEL, 1);
                    break;
                case SGILOGDATAFMT_8BIT:
                    bps = 8;
                    fmt = SAMPLEFORMAT_UINT;
                    break;
                default:
                    TIFFErrorExtR(
                        tif, tif->tif_name,
                        "Unknown data format %d for LogLuv compression",
                        sp->user_datafmt);
                    return (0);
            }
            TIFFSetField(tif, TIFFTAG_BITSPERSAMPLE, bps);
            TIFFSetField(tif, TIFFTAG_SAMPLEFORMAT, fmt);
            /*
             * Must recalculate sizes should bits/sample change.
             */
            tif->tif_tilesize = isTiled(tif) ? TIFFTileSize(tif) : (tmsize_t)-1;
            tif->tif_scanlinesize = TIFFScanlineSize(tif);
            return (1);
        case TIFFTAG_SGILOGENCODE:
            sp->encode_meth = (int)va_arg(ap, int);
            if (sp->encode_meth != SGILOGENCODE_NODITHER &&
                sp->encode_meth != SGILOGENCODE_RANDITHER)
            {
                TIFFErrorExtR(tif, module,
                              "Unknown encoding %d for LogLuv compression",
                              sp->encode_meth);
                return (0);
            }
            return (1);
        default:
            return (*sp->vsetparent)(tif, tag, ap);
    }
}